

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

void rw::compressPal4(uint8 *dst,uint32 dststride,uint8 *src,uint32 srcstride,int32 w,int32 h)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (0 < h) {
    uVar3 = 1;
    uVar4 = 0;
    iVar1 = 0;
    do {
      uVar5 = (ulong)(uint)(w / 2);
      uVar6 = uVar3;
      uVar2 = uVar4;
      if (1 < w) {
        do {
          dst[uVar2] = src[uVar6] << 4 | src[uVar6 - 1];
          uVar5 = uVar5 - 1;
          uVar6 = uVar6 + 2;
          uVar2 = uVar2 + 1;
        } while (uVar5 != 0);
      }
      iVar1 = iVar1 + 1;
      uVar3 = uVar3 + srcstride;
      uVar4 = uVar4 + dststride;
    } while (iVar1 != h);
  }
  return;
}

Assistant:

void
compressPal4(uint8 *dst, uint32 dststride, uint8 *src, uint32 srcstride, int32 w, int32 h)
{
	int32 x, y;
	for(y = 0; y < h; y++)
		for(x = 0; x < w/2; x++)
			dst[y*dststride + x] = src[y*srcstride + x*2 + 0] | src[y*srcstride + x*2 + 1] << 4;
}